

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t readback_part(curl_mimepart *part,char *buffer,size_t bufsize)

{
  mime_state *state;
  char *__dest;
  size_t *psVar1;
  mimestate mVar2;
  ulong uVar3;
  _Bool _Var4;
  char *pcVar5;
  size_t sVar6;
  curl_slist *pcVar7;
  _Bool _Var8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  bool bVar12;
  size_t local_58;
  char *local_50;
  
  if (bufsize == 0) {
    sVar9 = 0;
  }
  else {
    state = &part->state;
    __dest = (part->encstate).buf;
    sVar9 = 0;
    do {
      mVar2 = (part->state).state;
      uVar11 = 0;
      if (MIMESTATE_END < mVar2) goto switchD_0013df8b_caseD_5;
      pcVar7 = (curl_slist *)(part->state).ptr;
      switch(mVar2) {
      case MIMESTATE_BEGIN:
        pcVar7 = part->curlheaders;
        (part->state).state = ((part->flags & 2) >> 1) * 3 + MIMESTATE_CURLHEADERS;
        (part->state).ptr = pcVar7;
        goto LAB_0013e1f0;
      case MIMESTATE_CURLHEADERS:
switchD_0013df8b_caseD_1:
        if (pcVar7 == (curl_slist *)0x0) {
          pcVar7 = part->userheaders;
LAB_0013e1de:
          (part->state).state = MIMESTATE_USERHEADERS;
        }
        else {
          pcVar5 = pcVar7->data;
          sVar10 = strlen(pcVar5);
          uVar11 = readback_bytes(state,buffer,bufsize,pcVar5,sVar10,"\r\n");
          if (uVar11 != 0) break;
          pcVar7 = pcVar7->next;
        }
        (part->state).ptr = pcVar7;
LAB_0013e1f0:
        (part->state).offset = 0;
LAB_0013e21c:
        uVar11 = 0;
        break;
      case MIMESTATE_USERHEADERS:
        if (pcVar7 != (curl_slist *)0x0) {
          pcVar5 = match_header(pcVar7,"Content-Type",0xc);
          if (pcVar5 == (char *)0x0) goto switchD_0013df8b_caseD_1;
          pcVar7 = pcVar7->next;
          goto LAB_0013e1de;
        }
        state->state = MIMESTATE_EOH;
        goto LAB_0013e219;
      case MIMESTATE_EOH:
        uVar11 = readback_bytes(state,buffer,bufsize,"\r\n",2,"");
        if (uVar11 == 0) {
          state->state = MIMESTATE_BODY;
          goto LAB_0013e219;
        }
        break;
      case MIMESTATE_BODY:
        (part->encstate).pos = 0;
        (part->encstate).bufbeg = 0;
        (part->encstate).bufend = 0;
        state->state = MIMESTATE_CONTENT;
LAB_0013e219:
        (part->state).ptr = (void *)0x0;
        (part->state).offset = 0;
        goto LAB_0013e21c;
      case MIMESTATE_CONTENT:
        if (part->encoder == (mime_encoder *)0x0) {
          if (part->readfunc == (curl_read_callback)0x0) {
            uVar11 = 0;
          }
          else {
            uVar11 = (*part->readfunc)(buffer,1,bufsize,part->arg);
          }
        }
        else {
          bVar12 = false;
          _Var8 = false;
          uVar11 = 0;
          local_58 = bufsize;
          local_50 = buffer;
          do {
            while (((part->encstate).bufbeg < (part->encstate).bufend || (_Var8))) {
              sVar6 = (*part->encoder->encodefunc)(local_50,local_58,_Var8,part);
              if (sVar6 == 0) {
                if (_Var8 == false) break;
                goto LAB_0013e26f;
              }
              if ((sVar6 - 0x10000000 < 2) || (sVar6 == 0xffffffffffffffff)) {
LAB_0013e252:
                if (uVar11 == 0) {
                  uVar11 = sVar6;
                }
                goto LAB_0013e26f;
              }
              uVar11 = uVar11 + sVar6;
              local_50 = local_50 + sVar6;
              local_58 = local_58 - sVar6;
              bVar12 = local_58 == 0;
              if (bVar12) goto LAB_0013e26f;
            }
            sVar6 = (part->encstate).bufbeg;
            if (sVar6 != 0) {
              sVar10 = (part->encstate).bufend - sVar6;
              if (sVar10 != 0) {
                memmove(__dest,__dest + sVar6,sVar10);
              }
              (part->encstate).bufbeg = 0;
              (part->encstate).bufend = sVar10;
            }
            uVar3 = (part->encstate).bufend;
            if (0xff < uVar3) {
              uVar11 = uVar11 | -(ulong)(uVar11 == 0);
              break;
            }
            if (part->readfunc == (curl_read_callback)0x0) {
              sVar6 = 0;
            }
            else {
              sVar6 = (*part->readfunc)(__dest + uVar3,1,0x100 - uVar3,part->arg);
            }
            _Var4 = true;
            if (sVar6 != 0) {
              if ((sVar6 - 0x10000000 < 2) || (sVar6 == 0xffffffffffffffff)) goto LAB_0013e252;
              psVar1 = &(part->encstate).bufend;
              *psVar1 = *psVar1 + sVar6;
              _Var4 = _Var8;
            }
            _Var8 = _Var4;
          } while (!bVar12);
        }
LAB_0013e26f:
        if ((1 < uVar11 - 0x10000000) && (uVar11 != 0xffffffffffffffff)) {
          if (uVar11 != 0) break;
          (part->state).state = MIMESTATE_END;
          (part->state).ptr = (void *)0x0;
          (part->state).offset = 0;
          if ((part->kind == MIMEKIND_FILE) && ((FILE *)part->fp != (FILE *)0x0)) {
            fclose((FILE *)part->fp);
            part->fp = (FILE *)0x0;
          }
        }
        if (sVar9 == 0) {
          sVar9 = uVar11;
        }
      case MIMESTATE_END:
        goto switchD_0013df8b_caseD_8;
      }
switchD_0013df8b_caseD_5:
      sVar9 = sVar9 + uVar11;
      buffer = buffer + uVar11;
      bufsize = bufsize - uVar11;
    } while (bufsize != 0);
  }
switchD_0013df8b_caseD_8:
  return sVar9;
}

Assistant:

static size_t readback_part(curl_mimepart *part,
                            char *buffer, size_t bufsize)
{
  size_t cursize = 0;
  size_t sz;
  struct curl_slist *hdr;
#ifdef CURL_DOES_CONVERSIONS
  char *convbuf = buffer;
#endif

  /* Readback from part. */

  while(bufsize) {
    sz = 0;
    hdr = (struct curl_slist *) part->state.ptr;
    switch(part->state.state) {
    case MIMESTATE_BEGIN:
      mimesetstate(&part->state, part->flags & MIME_BODY_ONLY? MIMESTATE_BODY:
                                 MIMESTATE_CURLHEADERS, part->curlheaders);
      break;
    case MIMESTATE_USERHEADERS:
      if(!hdr) {
        mimesetstate(&part->state, MIMESTATE_EOH, NULL);
        break;
      }
      if(match_header(hdr, "Content-Type", 12)) {
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, hdr->next);
        break;
      }
      /* FALLTHROUGH */
    case MIMESTATE_CURLHEADERS:
      if(!hdr)
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, part->userheaders);
      else {
        sz = readback_bytes(&part->state, buffer, bufsize,
                            hdr->data, strlen(hdr->data), "\r\n");
        if(!sz)
          mimesetstate(&part->state, part->state.state, hdr->next);
      }
      break;
    case MIMESTATE_EOH:
      sz = readback_bytes(&part->state, buffer, bufsize, "\r\n", 2, "");
      if(!sz)
        mimesetstate(&part->state, MIMESTATE_BODY, NULL);
      break;
    case MIMESTATE_BODY:
#ifdef CURL_DOES_CONVERSIONS
      if(part->easy && convbuf < buffer) {
        CURLcode result = Curl_convert_to_network(part->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
        convbuf = buffer;
      }
#endif
      cleanup_encoder_state(&part->encstate);
      mimesetstate(&part->state, MIMESTATE_CONTENT, NULL);
      break;
    case MIMESTATE_CONTENT:
      if(part->encoder)
        sz = read_encoded_part_content(part, buffer, bufsize);
      else
        sz = read_part_content(part, buffer, bufsize);
      switch(sz) {
      case 0:
        mimesetstate(&part->state, MIMESTATE_END, NULL);
        /* Try sparing open file descriptors. */
        if(part->kind == MIMEKIND_FILE && part->fp) {
          fclose(part->fp);
          part->fp = NULL;
        }
        /* FALLTHROUGH */
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
        return cursize? cursize: sz;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* Other values not in part state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    bufsize -= sz;
  }

#ifdef CURL_DOES_CONVERSIONS
      if(part->easy && convbuf < buffer &&
         part->state.state < MIMESTATE_BODY) {
        CURLcode result = Curl_convert_to_network(part->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
      }
#endif

  return cursize;
}